

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

stacktrace * __thiscall
cpptrace::detail::lazy_trace_holder::get_resolved_trace(lazy_trace_holder *this)

{
  pointer puVar1;
  pointer puVar2;
  raw_trace old_trace;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  lazy_trace_holder local_68;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> local_48;
  
  if (this->resolved == false) {
    puVar1 = (this->field_1).trace.frames.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->field_1).trace.frames.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_80._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->field_1).trace.frames.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->field_1).trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.resolved = true;
    local_68.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.field_1.trace.frames.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80._M_impl.super__Vector_impl_data._M_start = puVar1;
    local_80._M_impl.super__Vector_impl_data._M_finish = puVar2;
    operator=(this,&local_68);
    clear(&local_68);
    std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
              (&local_48);
    if (puVar1 != puVar2) {
      raw_trace::resolve((stacktrace *)&local_68,(raw_trace *)&local_80);
      std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::
      _M_move_assign((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>
                      *)&this->field_1,&local_68);
      std::vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_>::~vector
                ((vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *)
                 &local_68);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_80);
  }
  return (stacktrace *)&this->field_1;
}

Assistant:

stacktrace& lazy_trace_holder::get_resolved_trace() {
            if(!resolved) {
                raw_trace old_trace = std::move(trace);
                *this = lazy_trace_holder(stacktrace{});
                try {
                    if(!old_trace.empty()) {
                        resolved_trace = old_trace.resolve();
                    }
                } catch(const std::exception& e) {
                    if(!detail::should_absorb_trace_exceptions()) {
                        // TODO: Append to message somehow?
                        std::fprintf(
                            stderr,
                            "Exception occurred while resolving trace in cpptrace::detail::lazy_trace_holder:\n%s\n",
                            e.what()
                        );
                    }
                }
            }
            return resolved_trace;
        }